

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::DropDomainIfEmpty
          (Registry *this,DomainId *aDomainId)

{
  byte bVar1;
  int iVar2;
  Status SVar3;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  nwks;
  Network npred;
  
  if (aDomainId->mId == 0xffffffff) {
    SVar3 = kSuccess;
  }
  else {
    Network::Network(&npred);
    nwks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nwks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nwks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    npred.mDomainId = (DomainId)aDomainId->mId;
    iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x16])(this->mStorage,&npred);
    bVar1 = (byte)iVar2;
    SVar3 = (bVar1 != 0) << 2;
    if (bVar1 < 2) {
      if (bVar1 == 1) {
        SVar3 = kNotFound;
      }
      if (nwks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          nwks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar2 = (*this->mStorage->_vptr_PersistentStorage[9])(this->mStorage,aDomainId);
        SVar3 = ((char)iVar2 != '\0') << 2;
        if ((char)iVar2 == '\x01') {
          SVar3 = kNotFound;
        }
      }
    }
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::~vector(&nwks);
    Network::~Network(&npred);
  }
  return SVar3;
}

Assistant:

Registry::Status Registry::DropDomainIfEmpty(const DomainId &aDomainId)
{
    Registry::Status status = Registry::Status::kSuccess;

    if (aDomainId.mId != EMPTY_ID)
    {
        Network              npred;
        std::vector<Network> nwks;

        npred.mDomainId = aDomainId;
        status          = MapStatus(mStorage->Lookup(npred, nwks));
        VerifyOrExit(status == Registry::Status::kSuccess || status == Registry::Status::kNotFound);
        if (nwks.size() == 0)
        {
            // Drop empty domain
            status = MapStatus(mStorage->Del(aDomainId));
        }
    }
exit:
    return status;
}